

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void entergen(lua_State *L,global_State *g)

{
  l_mem debt;
  global_State *pgVar1;
  
  pgVar1 = L->l_G;
  if (pgVar1->gcstate == '\b') goto LAB_0010e302;
  do {
    singlestep(L,1);
  } while (pgVar1->gcstate != '\b');
  pgVar1 = L->l_G;
  while (pgVar1->gcstate != '\0') {
LAB_0010e302:
    singlestep(L,1);
  }
  atomic(L);
  atomic2gen(L,g);
  debt = luaO_applyparam(g->gcparams[0],g->GCmajorminor);
  luaE_setdebt(g,debt);
  return;
}

Assistant:

static void entergen (lua_State *L, global_State *g) {
  luaC_runtilstate(L, GCSpause, 1);  /* prepare to start a new cycle */
  luaC_runtilstate(L, GCSpropagate, 1);  /* start new cycle */
  atomic(L);  /* propagates all and then do the atomic stuff */
  atomic2gen(L, g);
  setminordebt(g);  /* set debt assuming next cycle will be minor */
}